

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  undefined8 *puVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  ImGuiContext *g;
  long lVar14;
  uint uVar15;
  long lVar16;
  ImGuiWindow *window;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec2 IVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  pIVar11 = GImGui;
  pIVar8 = GImGui->CurrentWindow;
  if ((id == 0) ||
     ((((piVar1 = &(pIVar8->DC).NavLayerActiveMaskNext,
        *piVar1 = *piVar1 | (pIVar8->DC).NavLayerCurrentMask, pIVar11->NavId != id &&
        (pIVar11->NavAnyRequest != true)) ||
       (pIVar9 = pIVar11->NavWindow, pIVar9->RootWindowForNav != pIVar8->RootWindowForNav)) ||
      ((pIVar8 != pIVar9 && (((uint)(pIVar9->Flags | pIVar8->Flags) >> 0x17 & 1) == 0))))))
  goto LAB_0014a90e;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar6 = (pIVar8->DC).ItemFlags;
  fVar19 = (pIVar8->Pos).x;
  fVar20 = (pIVar8->Pos).y;
  fVar17 = (nav_bb_arg->Min).x - fVar19;
  fVar18 = (nav_bb_arg->Min).y - fVar20;
  fVar19 = (nav_bb_arg->Max).x - fVar19;
  fVar20 = (nav_bb_arg->Max).y - fVar20;
  if ((pIVar11->NavInitRequest == true) && (pIVar11->NavLayer == (pIVar8->DC).NavLayerCurrent)) {
    if (((uVar6 & 0x10) == 0) || (pIVar11->NavInitResultId == 0)) {
      pIVar11->NavInitResultId = id;
      IVar23.y = fVar18;
      IVar23.x = fVar17;
      IVar10.y = fVar20;
      IVar10.x = fVar19;
      (pIVar11->NavInitResultRectRel).Min = IVar23;
      (pIVar11->NavInitResultRectRel).Max = IVar10;
    }
    if ((uVar6 & 0x10) == 0) {
      pIVar11->NavInitRequest = false;
      if (pIVar11->NavMoveRequest == false) {
        pIVar11->NavAnyRequest = false;
      }
      else {
        pIVar11->NavAnyRequest = true;
        if (pIVar11->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                        ,0x935,"void NavUpdateAnyRequestFlag()");
        }
      }
    }
  }
  uVar15 = pIVar11->NavId;
  if ((uVar15 != id) && ((uVar6 & 8) == 0)) {
    pIVar9 = pIVar11->NavWindow;
    lVar14 = 0x1b28;
    if (pIVar9 == pIVar8) {
      lVar14 = 0x1af8;
    }
    if ((pIVar11->NavMoveRequest == true) &&
       (iVar7 = pIVar11->NavLayer, iVar7 == (pIVar8->DC).NavLayerCurrent)) {
      fVar22 = (nav_bb_arg->Min).x;
      fVar21 = (nav_bb_arg->Min).y;
      local_28 = nav_bb_arg->Max;
      pIVar11->NavScoringCount = pIVar11->NavScoringCount + 1;
      uVar6 = pIVar11->NavMoveDir;
      if (uVar6 < 2) {
        fVar27 = (pIVar8->ClipRect).Min.y;
        fVar25 = (pIVar8->ClipRect).Max.y;
        fVar24 = fVar25;
        if (fVar21 <= fVar25) {
          fVar24 = fVar21;
        }
        fVar21 = (float)(-(uint)(fVar21 < fVar27) & (uint)fVar27 |
                        ~-(uint)(fVar21 < fVar27) & (uint)fVar24);
        lVar16 = 1;
      }
      else {
        fVar27 = (pIVar8->ClipRect).Min.x;
        fVar25 = (pIVar8->ClipRect).Max.x;
        fVar24 = fVar25;
        if (fVar22 <= fVar25) {
          fVar24 = fVar22;
        }
        fVar22 = (float)(-(uint)(fVar22 < fVar27) & (uint)fVar27 |
                        ~-(uint)(fVar22 < fVar27) & (uint)fVar24);
        lVar16 = 0;
      }
      uStack_20 = 0;
      fVar24 = (&local_28.x)[lVar16];
      if (fVar24 <= fVar25) {
        fVar25 = fVar24;
      }
      (&local_28.x)[lVar16] =
           (float)(-(uint)(fVar24 < fVar27) & (uint)fVar27 |
                  ~-(uint)(fVar24 < fVar27) & (uint)fVar25);
      fVar27 = (pIVar11->NavScoringRectScreen).Min.x;
      fVar25 = (pIVar11->NavScoringRectScreen).Max.x;
      if (fVar27 <= local_28.x) {
        fVar24 = 0.0;
        if (fVar25 < fVar22) {
          fVar24 = fVar22 - fVar25;
        }
      }
      else {
        fVar24 = local_28.x - fVar27;
      }
      fVar26 = (local_28.y - fVar21) * 0.8 + fVar21;
      fVar4 = (pIVar11->NavScoringRectScreen).Min.y;
      fVar5 = (pIVar11->NavScoringRectScreen).Max.y;
      fVar28 = fVar5 - fVar4;
      fVar29 = fVar28 * 0.2 + fVar4;
      if (fVar29 <= fVar26) {
        fVar29 = (local_28.y - fVar21) * 0.2 + fVar21;
        fVar28 = fVar28 * 0.8 + fVar4;
        fVar26 = 0.0;
        if (fVar28 < fVar29) {
          fVar26 = fVar29 - fVar28;
        }
      }
      else {
        fVar26 = fVar26 - fVar29;
      }
      if (((fVar24 != 0.0) || (NAN(fVar24))) && ((fVar26 != 0.0 || (NAN(fVar26))))) {
        fVar24 = fVar24 / 1000.0 + *(float *)(&DAT_001ab690 + (ulong)(0.0 < fVar24) * 4);
      }
      fVar28 = ABS(fVar26) + ABS(fVar24);
      fVar22 = (fVar22 + local_28.x) - (fVar27 + fVar25);
      fVar21 = (fVar21 + local_28.y) - (fVar4 + fVar5);
      fVar27 = ABS(fVar22) + ABS(fVar21);
      if ((fVar26 != 0.0) || (NAN(fVar26))) {
LAB_0014aced:
        fVar25 = fVar28;
        uVar15 = (uint)(0.0 < fVar24);
        fVar22 = fVar24;
        fVar21 = fVar26;
        if (ABS(fVar24) <= ABS(fVar26)) {
          uVar15 = 0.0 < fVar26 | 2;
        }
      }
      else {
        if ((fVar24 != 0.0) || (NAN(fVar24))) goto LAB_0014aced;
        if ((((fVar22 != 0.0) || (NAN(fVar22))) || (fVar21 != 0.0)) || (NAN(fVar21))) {
          fVar25 = fVar27;
          uVar15 = (uint)(0.0 < fVar22);
          if (ABS(fVar22) <= ABS(fVar21)) {
            uVar15 = 0.0 < fVar21 | 2;
          }
        }
        else {
          fVar25 = 0.0;
          uVar15 = (uint)(uVar15 <= (pIVar8->DC).LastItemId);
          fVar22 = 0.0;
          fVar21 = 0.0;
        }
      }
      if (uVar15 != uVar6) goto LAB_0014ada5;
      fVar4 = *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x2c);
      if (fVar4 <= fVar28) {
        if ((fVar28 != fVar4) || (NAN(fVar28) || NAN(fVar4))) {
LAB_0014ada5:
          bVar12 = false;
        }
        else {
          fVar4 = *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x28);
          if (fVar4 <= fVar27) {
            if ((fVar27 == fVar4) && (!NAN(fVar27) && !NAN(fVar4))) {
              if ((uVar6 & 0xfffffffe) != 2) {
                fVar26 = fVar24;
              }
              if (fVar26 < 0.0) goto LAB_0014ada0;
            }
            goto LAB_0014ada5;
          }
          *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x28) = fVar27;
LAB_0014ada0:
          bVar12 = true;
        }
        fVar27 = *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x2c);
        if (((((fVar27 == 3.4028235e+38) && (!NAN(fVar27))) && (iVar7 == 1)) &&
            ((fVar25 < *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x24) &&
             ((pIVar9->Flags & 0x10000000) == 0)))) &&
           (((((uVar6 == 0 && (fVar22 < 0.0)) || ((uVar6 == 1 && (0.0 < fVar22)))) ||
             ((uVar6 == 2 && (fVar21 < 0.0)))) || ((uVar6 == 3 && (0.0 < fVar21)))))) {
          *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x24) = fVar25;
          bVar12 = true;
        }
        if (!bVar12) goto LAB_0014ae3f;
      }
      else {
        *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x2c) = fVar28;
        *(float *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x28) = fVar27;
      }
      *(ImGuiID *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x3c) = id;
      lVar16 = (long)(pIVar8->IDStack).Size;
      if (lVar16 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x4a4,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      *(uint *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x38) = (pIVar8->IDStack).Data[lVar16 + -1];
      *(ImGuiWindow **)((long)(pIVar11->IO).KeyMap + lVar14 + -0x34) = pIVar8;
      puVar2 = (undefined8 *)((long)(pIVar11->IO).KeyMap + lVar14 + -0x20);
      *puVar2 = CONCAT44(fVar18,fVar17);
      puVar2[1] = CONCAT44(fVar20,fVar19);
    }
  }
LAB_0014ae3f:
  if (pIVar11->NavId == id) {
    pIVar11->NavWindow = pIVar8;
    iVar7 = (pIVar8->DC).NavLayerCurrent;
    pIVar11->NavLayer = iVar7;
    pIVar11->NavIdIsAlive = true;
    pIVar11->NavIdTabCounter = pIVar8->FocusIdxTabCounter;
    pIVar3 = pIVar8->NavRectRel + iVar7;
    (pIVar3->Min).x = fVar17;
    (pIVar3->Min).y = fVar18;
    (pIVar3->Max).x = fVar19;
    (pIVar3->Max).y = fVar20;
  }
LAB_0014a90e:
  (pIVar8->DC).LastItemId = id;
  IVar10 = bb->Max;
  (pIVar8->DC).LastItemRect.Min = bb->Min;
  (pIVar8->DC).LastItemRect.Max = IVar10;
  (pIVar8->DC).LastItemStatusFlags = 0;
  bVar12 = IsClippedEx(bb,id,false);
  if ((!bVar12) && (bVar13 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar13)) {
    (pIVar8->DC).LastItemStatusFlags = 1;
  }
  return !bVar12;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window. 
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}